

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
* hevc_extract_priv_data
            (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *__return_storage_ptr__,uint8_t *buff,int size,uint8_t *nal_size)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  VodCoreException *pVVar5;
  pointer this;
  undefined1 local_550 [16];
  int k;
  ostringstream local_520 [8];
  ostringstream ss_2;
  int nalSize;
  ostringstream local_380 [8];
  ostringstream ss_1;
  int local_204;
  int j;
  int cnt;
  ostringstream local_1c8 [8];
  ostringstream ss;
  int local_4c;
  int i;
  uint8_t *end;
  uint8_t *src;
  int num_arrays;
  uint8_t *nal_size_local;
  int size_local;
  uint8_t *buff_local;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *spsPps;
  
  *nal_size = '\x04';
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(__return_storage_ptr__);
  if (0x16 < size) {
    *nal_size = (buff[0x15] & 3) + 1;
    bVar1 = buff[0x16];
    end = buff + 0x17;
    puVar4 = buff + size;
    for (local_4c = 0; local_4c < (int)(uint)bVar1; local_4c = local_4c + 1) {
      if (puVar4 < end + 3) {
        std::__cxx11::ostringstream::ostringstream(local_1c8);
        std::operator<<((ostream *)local_1c8,"Invalid HEVC extra data format");
        pVVar5 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar5,0x3b6,(string *)&cnt);
        __cxa_throw(pVVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      uVar2 = AV_RB16(end + 1);
      end = end + 3;
      for (local_204 = 0; local_204 < (int)(uint)uVar2; local_204 = local_204 + 1) {
        if (puVar4 < end + 2) {
          std::__cxx11::ostringstream::ostringstream(local_380);
          std::operator<<((ostream *)local_380,"Invalid HEVC extra data format");
          pVVar5 = (VodCoreException *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          VodCoreException::VodCoreException(pVVar5,0x3b6,(string *)&nalSize);
          __cxa_throw(pVVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        iVar3 = (uint)*end * 0x100 + (uint)end[1];
        end = end + 2;
        if (puVar4 < end + iVar3) {
          std::__cxx11::ostringstream::ostringstream(local_520);
          std::operator<<((ostream *)local_520,"Invalid HEVC extra data format");
          local_550[0xf] = 1;
          pVVar5 = (VodCoreException *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          VodCoreException::VodCoreException(pVVar5,0x3b6,(string *)&k);
          local_550[0xf] = 0;
          __cxa_throw(pVVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        if (iVar3 != 0) {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::emplace_back<>(__return_storage_ptr__);
          for (local_550._8_4_ = 0; (int)local_550._8_4_ < iVar3;
              local_550._8_4_ = local_550._8_4_ + 1) {
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::rbegin((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_550);
            this = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                 *)local_550);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this,end);
            end = end + 1;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<uint8_t>> hevc_extract_priv_data(const uint8_t* buff, int size, uint8_t* nal_size)
{
    *nal_size = 4;

    vector<vector<uint8_t>> spsPps;
    if (size < 23)
        return spsPps;

    *nal_size = (buff[21] & 3) + 1;
    int num_arrays = buff[22];

    const uint8_t* src = buff + 23;
    const uint8_t* end = buff + size;
    for (int i = 0; i < num_arrays; ++i)
    {
        if (src + 3 > end)
            THROW(ERR_MOV_PARSE, "Invalid HEVC extra data format")
        src++;  // type
        int cnt = AV_RB16(src);
        src += 2;

        for (int j = 0; j < cnt; ++j)
        {
            if (src + 2 > end)
                THROW(ERR_MOV_PARSE, "Invalid HEVC extra data format")
            int nalSize = (src[0] << 8) + src[1];
            src += 2;
            if (src + nalSize > end)
                THROW(ERR_MOV_PARSE, "Invalid HEVC extra data format")
            if (nalSize > 0)
            {
                spsPps.emplace_back();
                for (int k = 0; k < nalSize; ++k, ++src) spsPps.rbegin()->push_back(*src);
            }
        }
    }

    return spsPps;
}